

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void emit_bin_op(c2m_ctx_t c2m_ctx,node_t_conflict r,type *type,op_t res,op_t op1,op_t op2)

{
  ulong uVar1;
  MIR_context_t ctx;
  type *ptVar2;
  long lVar3;
  MIR_type_t t;
  MIR_insn_code_t code;
  mir_size_t mVar4;
  MIR_insn_t_conflict pMVar5;
  ulong uVar6;
  op_t local_148;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  ctx = c2m_ctx->ctx;
  if (type->mode == TM_PTR) {
    if ((r->code & ~N_LL) != N_ADD) {
      __assert_fail("r->code == N_ADD || r->code == N_SUB || r->code == N_ADD_ASSIGN || r->code == N_SUB_ASSIGN"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2f0d,"void emit_bin_op(c2m_ctx_t, node_t, struct type *, op_t, op_t, op_t)");
    }
    if (*(int *)(*(long *)((long)((r->u).ops.head)->attr + 0x18) + 0x18) != 3) {
      local_148.decl = op1.decl;
      local_148._8_8_ = op1._8_8_;
      local_148.mir_op.data = op1.mir_op.data;
      local_148.mir_op._8_8_ = op1.mir_op._8_8_;
      local_148.mir_op.u.i = op1.mir_op.u.i;
      local_148.mir_op.u.str.s = op1.mir_op.u.str.s;
      local_148.mir_op.u._16_8_ = op1.mir_op.u._16_8_;
      local_148.mir_op.u.mem.disp = op1.mir_op.u.mem.disp;
      op2.mir_op._8_1_ = op1.mir_op._8_1_;
      op2.mir_op.u.i = op1.mir_op.u.i;
    }
    if ((ushort)((byte)op2.mir_op._8_1_ - 3) < 2) {
      ptVar2 = (type->u).ptr_type;
      mVar4 = raw_type_size(c2m_ctx,ptVar2);
      uVar6 = (ulong)ptVar2->align;
      if (uVar6 != 0) {
        uVar1 = (mVar4 - 1) + uVar6;
        mVar4 = uVar1 - uVar1 % uVar6;
      }
      MIR_new_int_op(ctx,mVar4 * op2.mir_op.u.i);
      uStack_d8 = uStack_48;
      uStack_d0 = uStack_40;
      uStack_f8 = local_68;
      uStack_f0 = uStack_60;
      local_e8 = uStack_58;
      uStack_e0 = uStack_50;
    }
    else {
      t = get_mir_type(c2m_ctx,type);
      get_new_temp(&local_148,c2m_ctx,t);
      ptVar2 = (type->u).ptr_type;
      mVar4 = raw_type_size(c2m_ctx,ptVar2);
      uVar6 = (ulong)ptVar2->align;
      if (uVar6 != 0) {
        uVar1 = (mVar4 - 1) + uVar6;
        mVar4 = uVar1 - uVar1 % uVar6;
      }
      MIR_new_int_op(ctx,mVar4);
      pMVar5 = MIR_new_insn(c2m_ctx->ctx,MIR_MUL);
      emit_insn_opt(c2m_ctx,pMVar5);
    }
  }
  code = get_mir_type_insn_code(c2m_ctx,type,r);
  pMVar5 = MIR_new_insn(c2m_ctx->ctx,code);
  emit_insn_opt(c2m_ctx,pMVar5);
  if ((type->mode != TM_PTR) &&
     (lVar3 = *(long *)((long)((r->u).ops.head)->attr + 0x18), *(int *)(lVar3 + 0x18) == 3)) {
    if ((r->code & ~N_I) != N_SUB) {
      __assert_fail("r->code == N_SUB || r->code == N_SUB_ASSIGN",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2f1e,"void emit_bin_op(c2m_ctx_t, node_t, struct type *, op_t, op_t, op_t)");
    }
    ptVar2 = *(type **)(lVar3 + 0x30);
    mVar4 = raw_type_size(c2m_ctx,ptVar2);
    uVar6 = (ulong)ptVar2->align;
    if (uVar6 != 0) {
      uVar1 = (mVar4 - 1) + uVar6;
      mVar4 = uVar1 - uVar1 % uVar6;
    }
    MIR_new_int_op(ctx,mVar4);
    pMVar5 = MIR_new_insn(c2m_ctx->ctx,MIR_DIV);
    emit_insn_opt(c2m_ctx,pMVar5);
  }
  return;
}

Assistant:

static void emit_bin_op (c2m_ctx_t c2m_ctx, node_t r, struct type *type, op_t res, op_t op1,
                         op_t op2) {
  MIR_context_t ctx = c2m_ctx->ctx;
  op_t temp;

  if (type->mode == TM_PTR) { /* ptr +/- int */
    assert (r->code == N_ADD || r->code == N_SUB || r->code == N_ADD_ASSIGN
            || r->code == N_SUB_ASSIGN);
    if (((struct expr *) NL_HEAD (r->u.ops)->attr)->type->mode != TM_PTR) /* int + ptr */
      SWAP (op1, op2, temp);
    if (op2.mir_op.mode == MIR_OP_INT || op2.mir_op.mode == MIR_OP_UINT) {
      op2 = new_op (NULL,
                    MIR_new_int_op (ctx, op2.mir_op.u.i * type_size (c2m_ctx, type->u.ptr_type)));
    } else {
      temp = get_new_temp (c2m_ctx, get_mir_type (c2m_ctx, type));
      emit3 (c2m_ctx, sizeof (mir_size_t) == 8 ? MIR_MUL : MIR_MULS, temp.mir_op, op2.mir_op,
             MIR_new_int_op (ctx, type_size (c2m_ctx, type->u.ptr_type)));
      op2 = temp;
    }
  }
  emit3 (c2m_ctx, get_mir_type_insn_code (c2m_ctx, type, r), res.mir_op, op1.mir_op, op2.mir_op);
  if (type->mode != TM_PTR
      && (type = ((struct expr *) NL_HEAD (r->u.ops)->attr)->type)->mode
           == TM_PTR) { /* ptr - ptr */
    assert (r->code == N_SUB || r->code == N_SUB_ASSIGN);
    emit3 (c2m_ctx, sizeof (mir_size_t) == 8 ? MIR_DIV : MIR_DIVS, res.mir_op, res.mir_op,
           MIR_new_int_op (ctx, type_size (c2m_ctx, type->u.ptr_type)));
  }
}